

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::anon_unknown_0::LinesTestGroup::init
          (LinesTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  LineCase *pLVar1;
  TestNode *pTVar2;
  ColoredLineData *linesEnd;
  WindowRectangle *viewport;
  ColoredLineData local_338;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ColorlessLineData local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ColoredLineData local_d8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_338.p0.m_data[0] = 0.0;
  local_338.p0.m_data[1] = 0.0;
  local_338.p0.m_data[2] = 0.0;
  local_338.p0.m_data[3] = 1.0;
  local_338.c0.m_data[0] = 0.0;
  local_338.c0.m_data[1] = 1.5;
  local_338.c0.m_data[2] = 0.0;
  local_338.c0.m_data[3] = 1.0;
  local_338.p1.m_data[0] = 0.0;
  local_338.p1.m_data[1] = 0.0;
  local_338.p1.m_data[2] = 0.0;
  local_338.p1.m_data[3] = 1.0;
  local_338.c1.m_data[0] = -1.5;
  local_338.c1.m_data[1] = 1.0;
  local_338.c1.m_data[2] = 0.0;
  local_338.c1.m_data[3] = 1.0;
  local_2f8 = 0;
  uStack_2f0 = 0x3f80000000000000;
  local_2e8 = 0xbfc00000;
  uStack_2e0 = 0x3f80000000000000;
  local_2d8 = 0;
  uStack_2d0 = 0x3f80000000000000;
  local_2c8 = 0x3ecccccd3e4ccccd;
  uStack_2c0 = 0x3f8000003fc00000;
  local_2b8 = 0;
  uStack_2b0 = 0x3f80000000000000;
  local_2a8 = 0xbf800000c0000000;
  uStack_2a0 = 0x3f80000000000000;
  local_298 = 0;
  uStack_290 = 0x3f80000000000000;
  local_288 = 0x3dcccccd3f800000;
  uStack_280 = 0x3f19999a00000000;
  local_278 = 0x3fc00000;
  uStack_270 = 0x3f80000000000000;
  local_268 = 0xbe4ccccd3f4ccccd;
  uStack_260 = 0x3f80000000000000;
  local_258 = 0xbfc0000000000000;
  uStack_250 = 0x3f80000000000000;
  local_248 = 0xbf3333333f666666;
  uStack_240 = 0x3f80000000000000;
  local_238 = 0xbfa6666600000000;
  uStack_230 = 0x3f80000000000000;
  local_228 = 0x3fa66666;
  uStack_220 = 0x3f80000000000000;
  local_218 = 0xbf8147aebf4ccccd;
  uStack_210 = 0x3f80000000000000;
  local_208 = 0xbf8147ae00000000;
  uStack_200 = 0x3f80000000000000;
  local_1f8 = 0xc000a3d7;
  uStack_1f0 = 0x3f80000000000000;
  local_1e8 = 0xc000a3d700000000;
  uStack_1e0 = 0x3f80000000000000;
  local_d8.p0.m_data[0] = 0.0;
  local_d8.p0.m_data[1] = 0.0;
  local_d8.p0.m_data[2] = 0.0;
  local_d8.p0.m_data[3] = 1.0;
  local_d8.c0.m_data[0] = 1.3;
  local_d8.c0.m_data[1] = 1.0;
  local_d8.c0.m_data[2] = 2.0;
  local_d8.c0.m_data[3] = 1.0;
  local_d8.p1.m_data[0] = 0.0;
  local_d8.p1.m_data[1] = 0.0;
  local_d8.p1.m_data[2] = 0.0;
  local_d8.p1.m_data[3] = 1.0;
  local_d8.c1.m_data[0] = 1.3;
  local_d8.c1.m_data[1] = -1.0;
  local_d8.c1.m_data[2] = 2.0;
  local_d8.c1.m_data[3] = 1.0;
  local_98 = 0;
  uStack_90 = 0x3f80000000000000;
  local_88 = 0xbf8ccccdbf800000;
  uStack_80 = 0x3f800000c0000000;
  local_78 = 0;
  uStack_70 = 0x3f80000000000000;
  local_68 = 0x3f8ccccdbf800000;
  uStack_60 = 0x3f800000c0000000;
  local_58 = 0;
  uStack_50 = 0x3f80000000000000;
  local_48 = 0x3dcccccd3f800000;
  uStack_40 = 0x3f19999a40000000;
  viewport = (WindowRectangle *)0xc71c4000c7202800;
  local_1d8.p0.m_data[0] = 0.0;
  local_1d8.p0.m_data[1] = 0.0;
  local_1d8.p0.m_data[2] = 0.0;
  local_1d8.p0.m_data[3] = 1.0;
  local_1d8.p1.m_data[0] = 1.0;
  local_1d8.p1.m_data[1] = 0.0;
  local_1d8.p1.m_data[2] = 0.0;
  local_1d8.p1.m_data[3] = 1.0;
  local_1b8 = 0x3f8000003fa66666;
  uStack_1b0 = 0x3f80000040000000;
  local_1a8 = 0x3f8000003f800000;
  uStack_1a0 = 0x3f80000000000000;
  local_198 = 0;
  uStack_190 = 0x3f80000000000000;
  local_188 = 0x3f800000;
  uStack_180 = 0x3f80000000000000;
  local_178 = 0xbf8000003fa66666;
  uStack_170 = 0x3f80000040000000;
  local_168 = 0x3e99999a3e99999a;
  uStack_160 = 0x3f8000003f800000;
  local_158 = 0;
  uStack_150 = 0x3f80000000000000;
  local_148 = 0x3f800000;
  uStack_140 = 0x3f80000000000000;
  local_138 = 0xbf800000bf800000;
  uStack_130 = 0x3f800000c0000000;
  local_128 = 0x3f8000003f800000;
  uStack_120 = 0x3f80000000000000;
  local_118 = 0;
  uStack_110 = 0x3f80000000000000;
  local_108 = 0x3f800000;
  uStack_100 = 0x3f80000000000000;
  local_f8 = 0x3f800000bf800000;
  uStack_f0 = 0x3f800000c0000000;
  local_e8 = 0x3e99999a3e99999a;
  uStack_e0 = 0x3f8000003f800000;
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_z_clip","line z clipping",
                     (ColorlessLineData *)&local_d8,(ColorlessLineData *)&stack0xffffffffffffffc8,
                     1.0,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_z_clip_viewport_center",
                     "line z clipping",(ColorlessLineData *)&local_d8,
                     (ColorlessLineData *)&stack0xffffffffffffffc8,1.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_z_clip_viewport_corner",
                     "line z clipping",(ColorlessLineData *)&local_d8,
                     (ColorlessLineData *)&stack0xffffffffffffffc8,1.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_clip_viewport_center",
                     "line viewport clipping",(ColorlessLineData *)&local_338,&local_1d8,1.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"line_clip_viewport_corner",
                     "line viewport clipping",(ColorlessLineData *)&local_338,&local_1d8,1.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_z_clip",
                     "line z clipping",(ColorlessLineData *)&local_d8,
                     (ColorlessLineData *)&stack0xffffffffffffffc8,5.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_z_clip_viewport_center"
                     ,"line z clipping",(ColorlessLineData *)&local_d8,
                     (ColorlessLineData *)&stack0xffffffffffffffc8,5.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_z_clip_viewport_corner"
                     ,"line z clipping",(ColorlessLineData *)&local_d8,
                     (ColorlessLineData *)&stack0xffffffffffffffc8,5.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_clip",
                     "line viewport clipping",(ColorlessLineData *)&local_338,&local_1d8,5.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_clip_viewport_center",
                     "line viewport clipping",(ColorlessLineData *)&local_338,&local_1d8,5.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"wide_line_clip_viewport_corner",
                     "line viewport clipping",(ColorlessLineData *)&local_338,&local_1d8,5.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  linesEnd = &local_338;
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"long_line_clip",
                     "line viewport clipping",(ColorlessLineData *)&stack0xfffffffffffffc48,
                     (ColorlessLineData *)linesEnd,1.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LineCase *)operator_new(0xb0);
  LineCase::LineCase(pLVar1,(this->super_TestCaseGroup).m_context,"long_wide_line_clip",
                     "line viewport clipping",(ColorlessLineData *)&stack0xfffffffffffffc48,
                     (ColorlessLineData *)linesEnd,5.0,
                     (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE,2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pTVar2 = (TestNode *)operator_new(0xa8);
  ColoredLineCase::ColoredLineCase
            ((ColoredLineCase *)pTVar2,(this->super_TestCaseGroup).m_context,"line_attrib_clip",
             (char *)&local_1d8,&local_d8,linesEnd,1.0,viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  ColoredLineCase::ColoredLineCase
            ((ColoredLineCase *)pTVar2,(this->super_TestCaseGroup).m_context,"wide_line_attrib_clip"
             ,(char *)&local_1d8,&local_d8,linesEnd,5.0,viewport);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void LinesTestGroup::init (void)
{
	const float littleOverViewport = 1.0f + (2.0f / (TEST_CANVAS_SIZE)); // one pixel over the viewport edge in VIEWPORT_WHOLE, half pixels over in the reduced viewport.

	// lines
	const LineRenderTestCase::ColorlessLineData viewportTestLines[] =
	{
		// from center to outside of viewport
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 0.0f,  1.5f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-1.5f,  1.0f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-1.5f,  0.0f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 0.2f,  0.4f,  1.5f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-2.0f, -1.0f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 1.0f,  0.1f,  0.0f,  0.6f)},

		// from outside to inside of viewport
		{tcu::Vec4( 1.5f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 0.8f, -0.2f,  0.0f,  1.0f)},
		{tcu::Vec4( 0.0f, -1.5f,  0.0f,  1.0f),		tcu::Vec4( 0.9f, -0.7f,  0.0f,  1.0f)},

		// from outside to outside
		{tcu::Vec4( 0.0f, -1.3f,  0.0f,  1.0f),		tcu::Vec4( 1.3f,  0.0f,  0.0f,  1.0f)},

		// outside the viewport, wide lines have fragments in the viewport
		{tcu::Vec4(-0.8f,                      -littleOverViewport,  0.0f,  1.0f),	tcu::Vec4( 0.0f, -littleOverViewport,         0.0f,  1.0f)},
		{tcu::Vec4(-littleOverViewport - 1.0f,  0.0f,                0.0f,  1.0f),	tcu::Vec4( 0.0f, -littleOverViewport - 1.0f,  0.0f,  1.0f)},
	};
	const LineRenderTestCase::ColorlessLineData depthTestLines[] =
	{
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 1.3f,  1.0f,  2.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 1.3f, -1.0f,  2.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-1.0f, -1.1f, -2.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4(-1.0f,  1.1f, -2.0f,  1.0f)},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),		tcu::Vec4( 1.0f,  0.1f,  2.0f,  0.6f)},
	};
	const LineRenderTestCase::ColorlessLineData longTestLines[] =
	{
		{tcu::Vec4( -41000.0f,		-40000.0f,		-1000000.0f,	1.0f),	tcu::Vec4( 41000.0f,		40000.0f,		1000000.0f,	1.0f)},
		{tcu::Vec4(  41000.0f,		-40000.0f,		 1000000.0f,	1.0f),	tcu::Vec4(-41000.0f,		40000.0f,	   -1000000.0f,	1.0f)},
		{tcu::Vec4(  0.5f,			-40000.0f,		 100000.0f,		1.0f),	tcu::Vec4( 0.5f,			40000.0f,	   -100000.0f,	1.0f)},
		{tcu::Vec4( -0.5f,			 40000.0f,		 100000.0f,		1.0f),	tcu::Vec4(-0.5f,		   -40000.0f,	   -100000.0f,	1.0f)},
	};

	// line attribute clipping
	const tcu::Vec4 red			(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 lightBlue	(0.3f, 0.3f, 1.0f, 1.0f);
	const LineRenderTestCase::ColoredLineData colorTestLines[] =
	{
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),	red,	tcu::Vec4( 1.3f,  1.0f,  2.0f,  1.0f),	yellow		},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),	red,	tcu::Vec4( 1.3f, -1.0f,  2.0f,  1.0f),	lightBlue	},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),	red,	tcu::Vec4(-1.0f, -1.0f, -2.0f,  1.0f),	yellow		},
		{tcu::Vec4( 0.0f,  0.0f,  0.0f,  1.0f),	red,	tcu::Vec4(-1.0f,  1.0f, -2.0f,  1.0f),	lightBlue	},
	};

	// line clipping
	addChild(new LineCase(m_context, "line_z_clip",							"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		1.0f,	VIEWPORT_WHOLE));
	addChild(new LineCase(m_context, "line_z_clip_viewport_center",			"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		1.0f,	VIEWPORT_CENTER));
	addChild(new LineCase(m_context, "line_z_clip_viewport_corner",			"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		1.0f,	VIEWPORT_CORNER));

	addChild(new LineCase(m_context, "line_clip_viewport_center",			"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	1.0f,	VIEWPORT_CENTER));
	addChild(new LineCase(m_context, "line_clip_viewport_corner",			"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	1.0f,	VIEWPORT_CORNER));

	addChild(new LineCase(m_context, "wide_line_z_clip",					"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		5.0f,	VIEWPORT_WHOLE));
	addChild(new LineCase(m_context, "wide_line_z_clip_viewport_center",	"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		5.0f,	VIEWPORT_CENTER));
	addChild(new LineCase(m_context, "wide_line_z_clip_viewport_corner",	"line z clipping",				DE_ARRAY_BEGIN(depthTestLines),		DE_ARRAY_END(depthTestLines),		5.0f,	VIEWPORT_CORNER));

	addChild(new LineCase(m_context, "wide_line_clip",						"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	5.0f,	VIEWPORT_WHOLE));
	addChild(new LineCase(m_context, "wide_line_clip_viewport_center",		"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	5.0f,	VIEWPORT_CENTER));
	addChild(new LineCase(m_context, "wide_line_clip_viewport_corner",		"line viewport clipping",		DE_ARRAY_BEGIN(viewportTestLines),	DE_ARRAY_END(viewportTestLines),	5.0f,	VIEWPORT_CORNER));

	addChild(new LineCase(m_context, "long_line_clip",						"line viewport clipping",		DE_ARRAY_BEGIN(longTestLines),		DE_ARRAY_END(longTestLines),		1.0f,	VIEWPORT_WHOLE, 2));
	addChild(new LineCase(m_context, "long_wide_line_clip",					"line viewport clipping",		DE_ARRAY_BEGIN(longTestLines),		DE_ARRAY_END(longTestLines),		5.0f,	VIEWPORT_WHOLE, 2));

	// line attribute clipping
	addChild(new ColoredLineCase(m_context, "line_attrib_clip",				"line attribute clipping",		DE_ARRAY_BEGIN(colorTestLines),		DE_ARRAY_END(colorTestLines),		1.0f,	VIEWPORT_WHOLE));
	addChild(new ColoredLineCase(m_context, "wide_line_attrib_clip",		"line attribute clipping",		DE_ARRAY_BEGIN(colorTestLines),		DE_ARRAY_END(colorTestLines),		5.0f,	VIEWPORT_WHOLE));
}